

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall
CLI::App::add_flag_function
          (App *this,string *flag_name,function<void_(long)> *function,string *flag_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MultiOptionPolicy MVar2;
  pointer pcVar3;
  Option *pOVar4;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  string local_80;
  string local_60;
  _Any_data local_40;
  long local_30;
  undefined8 local_28;
  
  std::function<void_(long)>::function((function<void_(long)> *)&local_40,function);
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_c8._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_c8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x18) = local_28;
  if (local_30 != 0) {
    *(undefined4 *)local_c8._M_unused._0_8_ = local_40._0_4_;
    *(undefined4 *)((long)local_c8._M_unused._0_8_ + 4) = local_40._4_4_;
    *(undefined4 *)((long)local_c8._M_unused._0_8_ + 8) = local_40._8_4_;
    *(undefined4 *)((long)local_c8._M_unused._0_8_ + 0xc) = local_40._12_4_;
    *(long *)((long)local_c8._M_unused._0_8_ + 0x10) = local_30;
  }
  pcStack_b0 = std::
               _Function_handler<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:8163:27)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:8163:27)>
             ::_M_manager;
  pcVar3 = (flag_name->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar3,pcVar3 + flag_name->_M_string_length);
  local_a8._M_unused._M_object = (undefined8 *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  local_90 = pcStack_b0;
  if (local_b8 != (code *)0x0) {
    local_a8._M_unused._M_function_pointer = (_func_void *)local_c8._M_unused._0_8_;
    local_a8._8_8_ = local_c8._8_8_;
    local_98 = local_b8;
    local_b8 = (code *)0x0;
    pcStack_b0 = (code *)0x0;
  }
  local_80._M_dataplus._M_p = (flag_description->_M_dataplus)._M_p;
  paVar1 = &flag_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == paVar1) {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&flag_description->field_2 + 8);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_80._M_string_length = flag_description->_M_string_length;
  (flag_description->_M_dataplus)._M_p = (pointer)paVar1;
  flag_description->_M_string_length = 0;
  (flag_description->field_2)._M_local_buf[0] = '\0';
  pOVar4 = _add_flag_internal(this,&local_60,(callback_t *)&local_a8,&local_80);
  MVar2 = (pOVar4->super_OptionBase<CLI::Option>).multi_option_policy_;
  if (MVar2 != Sum) {
    if (((MVar2 == Throw) && (pOVar4->expected_max_ == 0x20000000)) && (1 < pOVar4->expected_min_))
    {
      pOVar4->expected_max_ = pOVar4->expected_min_;
    }
    (pOVar4->super_OptionBase<CLI::Option>).multi_option_policy_ = Sum;
    pOVar4->current_option_state_ = parsing;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  return pOVar4;
}

Assistant:

CLI11_INLINE Option *
App::add_flag_function(std::string flag_name,
                       std::function<void(std::int64_t)> function,  ///< A function to call, void(int)
                       std::string flag_description) {

    CLI::callback_t fun = [function](const CLI::results_t &res) {
        using CLI::detail::lexical_cast;
        std::int64_t flag_count{0};
        lexical_cast(res[0], flag_count);
        function(flag_count);
        return true;
    };
    return _add_flag_internal(flag_name, std::move(fun), std::move(flag_description))
        ->multi_option_policy(MultiOptionPolicy::Sum);
}